

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Heap.h
# Opt level: O1

void __thiscall
Minisat::Heap<int,_Minisat::SimpSolver::ElimLt,_Minisat::MkIndexDefault<int>_>::percolateUp
          (Heap<int,_Minisat::SimpSolver::ElimLt,_Minisat::MkIndexDefault<int>_> *this,int i)

{
  uint uVar1;
  Var x;
  Var x_00;
  int *piVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  int iVar5;
  
  x = (this->heap).data[i];
  if (i != 0) {
    do {
      uVar1 = i - 1;
      iVar5 = (int)uVar1 >> 1;
      x_00 = (this->heap).data[iVar5];
      uVar3 = SimpSolver::ElimLt::cost(&this->lt,x);
      uVar4 = SimpSolver::ElimLt::cost(&this->lt,x_00);
      if (uVar4 <= uVar3) break;
      piVar2 = (this->heap).data;
      piVar2[i] = piVar2[iVar5];
      if ((this->indices).map.sz <= piVar2[iVar5]) goto LAB_0011373b;
      (this->indices).map.data[piVar2[iVar5]] = i;
      i = iVar5;
    } while (1 < uVar1);
  }
  (this->heap).data[i] = x;
  if (x < (this->indices).map.sz) {
    (this->indices).map.data[x] = i;
    return;
  }
LAB_0011373b:
  __assert_fail("has(k)",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/Udopia[P]minisat/minisat/mtl/IntMap.h"
                ,0x28,
                "V &Minisat::IntMap<int, int>::operator[](K) [K = int, V = int, MkIndex = Minisat::MkIndexDefault<int>]"
               );
}

Assistant:

void percolateUp(int i)
    {
        K   x  = heap[i];
        int p  = parent(i);
        
        while (i != 0 && lt(x, heap[p])){
            heap[i]          = heap[p];
            indices[heap[p]] = i;
            i                = p;
            p                = parent(p);
        }
        heap   [i] = x;
        indices[x] = i;
    }